

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O0

bool __thiscall
sf::priv::WindowImpl::createVulkanSurface
          (WindowImpl *this,VkInstance *instance,VkSurfaceKHR *surface,
          VkAllocationCallbacks *allocator)

{
  bool bVar1;
  long *in_RDI;
  VkInstance *in_stack_00000028;
  
  (**(code **)(*in_RDI + 0x10))();
  bVar1 = VulkanImplX11::createVulkanSurface
                    (in_stack_00000028,(WindowHandle)this,(VkSurfaceKHR *)instance,
                     (VkAllocationCallbacks *)surface);
  return bVar1;
}

Assistant:

bool WindowImpl::createVulkanSurface(const VkInstance& instance, VkSurfaceKHR& surface, const VkAllocationCallbacks* allocator)
{
#if defined(SFML_VULKAN_IMPLEMENTATION_NOT_AVAILABLE)

    (void) instance;
    (void) surface;
    (void) allocator;
    return false;

#else

    return VulkanImplType::createVulkanSurface(instance, getSystemHandle(), surface, allocator);

#endif
}